

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SenderFlow.cpp
# Opt level: O0

void __thiscall SenderFlow::SenderFlow(SenderFlow *this,string *bind,int port)

{
  int iVar1;
  void *pvVar2;
  ostream *poVar3;
  undefined8 uVar4;
  SenderFlowEx *pSVar5;
  int *piVar6;
  char *pcVar7;
  undefined4 local_3d8;
  undefined1 local_3d2;
  allocator<char> local_3d1;
  int linger;
  string local_3b0 [38];
  undefined1 local_38a;
  allocator<char> local_389;
  string local_388;
  string local_368 [36];
  int local_344;
  stringstream local_340 [4];
  int rc;
  stringstream notf_addr;
  ostream local_330 [392];
  stringstream local_1a8 [8];
  stringstream stream_addr;
  ostream local_198 [380];
  int local_1c;
  string *psStack_18;
  int port_local;
  string *bind_local;
  SenderFlow *this_local;
  
  local_1c = port;
  psStack_18 = bind;
  bind_local = (string *)this;
  pvVar2 = (void *)zmq_ctx_new();
  this->m_context = pvVar2;
  pvVar2 = (void *)zmq_socket(this->m_context,8);
  this->m_stream_socket = pvVar2;
  pvVar2 = (void *)zmq_socket(this->m_context,1);
  this->m_notif_socket = pvVar2;
  std::__cxx11::string::string((string *)&this->m_name);
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar3 = std::operator<<(local_198,(string *)bind);
  poVar3 = std::operator<<(poVar3,":");
  std::ostream::operator<<(poVar3,local_1c);
  std::__cxx11::stringstream::stringstream(local_340);
  poVar3 = std::operator<<(local_330,(string *)bind);
  poVar3 = std::operator<<(poVar3,":");
  std::ostream::operator<<(poVar3,local_1c + 1);
  pvVar2 = this->m_stream_socket;
  std::__cxx11::stringstream::str();
  uVar4 = std::__cxx11::string::c_str();
  iVar1 = zmq_bind(pvVar2,uVar4);
  std::__cxx11::string::~string(local_368);
  local_344 = iVar1;
  if (iVar1 == -1) {
    local_38a = 1;
    pSVar5 = (SenderFlowEx *)__cxa_allocate_exception(0x10);
    piVar6 = __errno_location();
    pcVar7 = strerror(*piVar6);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_388,pcVar7,&local_389);
    SenderFlowEx::SenderFlowEx(pSVar5,&local_388);
    local_38a = 0;
    __cxa_throw(pSVar5,&SenderFlowEx::typeinfo,SenderFlowEx::~SenderFlowEx);
  }
  pvVar2 = this->m_notif_socket;
  std::__cxx11::stringstream::str();
  uVar4 = std::__cxx11::string::c_str();
  local_344 = zmq_bind(pvVar2,uVar4);
  std::__cxx11::string::~string(local_3b0);
  if (local_344 == -1) {
    local_3d2 = 1;
    pSVar5 = (SenderFlowEx *)__cxa_allocate_exception(0x10);
    piVar6 = __errno_location();
    pcVar7 = strerror(*piVar6);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&linger,pcVar7,&local_3d1);
    SenderFlowEx::SenderFlowEx(pSVar5,(string *)&linger);
    local_3d2 = 0;
    __cxa_throw(pSVar5,&SenderFlowEx::typeinfo,SenderFlowEx::~SenderFlowEx);
  }
  local_3d8 = 0xffffffff;
  zmq_setsockopt(this->m_stream_socket,0x11,&local_3d8,4);
  zmq_setsockopt(this->m_notif_socket,0x11,&local_3d8,4);
  std::__cxx11::stringstream::~stringstream(local_340);
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return;
}

Assistant:

SenderFlow::SenderFlow(std::string bind, int port) :
    m_context(zmq_ctx_new()),
    m_stream_socket(zmq_socket(m_context, ZMQ_PUSH)),
    m_notif_socket(zmq_socket(m_context, ZMQ_PUB))
{
    // prepare full address
    std::stringstream stream_addr;
    stream_addr << bind << ":" << port;
    std::stringstream notf_addr;
    notf_addr << bind << ":" << (port + 1);
    // bind the port for the stream endpoint
    int rc = zmq_bind(m_stream_socket, stream_addr.str().c_str());
    if (rc == -1) {
        throw SenderFlowEx(strerror(errno));
    }
    // bind the port for the notification channel endpoint
    rc = zmq_bind(m_notif_socket, notf_addr.str().c_str());
    if (rc == -1) {
        throw SenderFlowEx(strerror(errno));
    }
    int linger = -1;
    zmq_setsockopt(m_stream_socket, ZMQ_LINGER, &linger, sizeof(linger));
    zmq_setsockopt(m_notif_socket, ZMQ_LINGER, &linger, sizeof(linger));
}